

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O0

ion_err_t ion_lookup_in_master_table(ion_dictionary_id_t id,ion_dictionary_config_info_t *config)

{
  ion_err_t error;
  ion_dictionary_config_info_t *config_local;
  ion_dictionary_id_t id_local;
  
  config->id = id;
  config_local._7_1_ = ion_master_table_read(config,-1);
  if (config_local._7_1_ == '\0') {
    config_local._7_1_ = '\0';
  }
  return config_local._7_1_;
}

Assistant:

ion_err_t
ion_lookup_in_master_table(
	ion_dictionary_id_t				id,
	ion_dictionary_config_info_t	*config
) {
	ion_err_t error = err_ok;

	config->id	= id;
	error		= ion_master_table_read(config, ION_MASTER_TABLE_CALCULATE_POS);

	if (err_ok != error) {
		return error;
	}

	return err_ok;
}